

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

void inproc_ep_connect(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  int iVar2;
  inproc_ep *local_28;
  inproc_ep *server;
  inproc_ep *ep;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock(&nni_inproc.mx);
  local_28 = (inproc_ep *)nni_list_first(&nni_inproc.servers);
  while ((local_28 != (inproc_ep *)0x0 && (iVar2 = strcmp(local_28->addr,*arg), iVar2 != 0))) {
    local_28 = (inproc_ep *)nni_list_next(&nni_inproc.servers,local_28);
  }
  if (local_28 == (inproc_ep *)0x0) {
    nni_mtx_unlock(&nni_inproc.mx);
    nni_aio_finish_error(aio,NNG_ECONNREFUSED);
  }
  else {
    _Var1 = nni_aio_start(aio,inproc_ep_cancel,arg);
    if (_Var1) {
      nni_list_append(&local_28->clients,arg);
      nni_aio_list_append((nni_list *)((long)arg + 0x80),aio);
      inproc_accept_clients(local_28);
      nni_mtx_unlock(&nni_inproc.mx);
    }
    else {
      nni_mtx_unlock(&nni_inproc.mx);
    }
  }
  return;
}

Assistant:

static void
inproc_ep_connect(void *arg, nni_aio *aio)
{
	inproc_ep *ep = arg;
	inproc_ep *server;

	nni_aio_reset(aio);

	nni_mtx_lock(&nni_inproc.mx);

	// Find a server.
	NNI_LIST_FOREACH (&nni_inproc.servers, server) {
		if (strcmp(server->addr, ep->addr) == 0) {
			break;
		}
	}
	if (server == NULL) {
		nni_mtx_unlock(&nni_inproc.mx);
		nni_aio_finish_error(aio, NNG_ECONNREFUSED);
		return;
	}

	// We don't have to worry about the case where a zero timeout
	// on connect was specified, as there is no option to specify
	// that in the upper API.
	if (!nni_aio_start(aio, inproc_ep_cancel, ep)) {
		nni_mtx_unlock(&nni_inproc.mx);
		return;
	}

	nni_list_append(&server->clients, ep);
	nni_aio_list_append(&ep->aios, aio);

	inproc_accept_clients(server);
	nni_mtx_unlock(&nni_inproc.mx);
}